

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-ignore.c
# Opt level: O1

void ignore_drop(player *p)

{
  uint32_t *puVar1;
  loc grid;
  player_upkeep *ppVar2;
  _Bool _Var3;
  uint uVar4;
  object *obj;
  command_conflict *cmd;
  char *pcVar5;
  quark_t qVar6;
  char buffer [1024];
  char local_438 [1032];
  
  obj = gear_last_item(p);
  if (obj != (object *)0x0) {
    do {
      if (obj->kind == (object_kind *)0x0) {
        __assert_fail("obj->kind",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-ignore.c"
                      ,0x27d,"void ignore_drop(struct player *)");
      }
      if ((((p->unignoring == '\0') && (_Var3 = object_is_ignored(obj), _Var3)) &&
          (uVar4 = check_for_inscrip(obj,"!d"), uVar4 == 0)) &&
         (uVar4 = check_for_inscrip(obj,"!*"), uVar4 == 0)) {
        _Var3 = object_is_equipped(p->body,obj);
        if ((!_Var3) || (_Var3 = verify_object("Really take off and drop",obj,p), _Var3)) {
          grid.x = (p->grid).x;
          grid.y = (p->grid).y;
          _Var3 = square_isshop(cave,grid);
          if (!_Var3) {
            p->upkeep->dropping = true;
            cmdq_push(CMD_DROP);
            cmd = cmdq_peek();
            if (cmd == (command_conflict *)0x0) {
              __assert_fail("drop_cmd",
                            "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-ignore.c"
                            ,0x29d,"void ignore_drop(struct player *)");
            }
            cmd_set_arg_item(cmd,"item",obj);
            cmd_set_arg_number(cmd,"quantity",(uint)obj->number);
            cmd->background_command = 2;
          }
        }
        else {
          pcVar5 = quark_str(obj->note);
          if (pcVar5 == (char *)0x0) {
            pcVar5 = "!d";
          }
          else {
            my_strcpy(local_438,pcVar5,0x400);
            my_strcat(local_438,"!d",0x400);
            pcVar5 = local_438;
          }
          qVar6 = quark_add(pcVar5);
          obj->note = qVar6;
        }
      }
      obj = obj->prev;
    } while (obj != (object *)0x0);
  }
  ppVar2 = p->upkeep;
  puVar1 = &ppVar2->update;
  *puVar1 = *puVar1 | 0x400;
  puVar1 = &ppVar2->notice;
  *(byte *)puVar1 = (byte)*puVar1 | 1;
  return;
}

Assistant:

void ignore_drop(struct player *p)
{
	struct object *obj;

	/* Scan through the slots backwards */
	for (obj = gear_last_item(p); obj; obj = obj->prev) {
		/* Skip non-objects and unignoreable objects */
		assert(obj->kind);
		if (!ignore_item_ok(p, obj)) continue;

		/* Check for !d (no drop) inscription */
		if (!check_for_inscrip(obj, "!d") && !check_for_inscrip(obj, "!*")) {
			/* Confirm the drop if the item is equipped. */
			if (object_is_equipped(p->body, obj)) {
				if (!verify_object("Really take off and drop", obj, p)) {
					/* Hack - inscribe the item with !d to prevent repeated
					 * confirmations. */
					const char *inscription = quark_str(obj->note);

					if (inscription == NULL) {
						obj->note = quark_add("!d");
					} else {
						char buffer[1024];
						my_strcpy(buffer, inscription, sizeof(buffer));
						my_strcat(buffer, "!d", sizeof(buffer));
						obj->note = quark_add(buffer);
					}

					continue;
				}
			}

			/* We're allowed to drop it. */
			if (!square_isshop(cave, p->grid)) {
				struct command *drop_cmd;

				p->upkeep->dropping = true;
				cmdq_push(CMD_DROP);
				drop_cmd = cmdq_peek();
				assert(drop_cmd);
				cmd_set_arg_item(drop_cmd, "item", obj);
				cmd_set_arg_number(drop_cmd, "quantity",
					obj->number);
				/*
				 * This drop is a side effect:  whatever
				 * command triggered it will be the target
				 * for CMD_REPEAT rather than repeating the
				 * drop, and the drop will not trigger
				 * bloodlust.
				 */
				drop_cmd->background_command = 2;
			}
		}
	}

	/* Update the gear */
	p->upkeep->update |= (PU_INVEN);

	/* Combine/reorder the pack */
	p->upkeep->notice |= (PN_COMBINE);
}